

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# abcFunc.c
# Opt level: O2

int Abc_NtkBddToSop(Abc_Ntk_t *pNtk,int fMode,int nCubeLimit)

{
  uint uVar1;
  uint uVar2;
  uint uVar3;
  DdNode *bFuncOn;
  int iVar4;
  int iVar5;
  uint uVar6;
  Vec_Int_t *p;
  Vec_Ptr_t *p_00;
  DdNode **pFuncs;
  Abc_Obj_t *pAVar7;
  Mem_Flex_t *pMan;
  Vec_Str_t *p_01;
  Abc_Obj_t *pSop;
  int iVar8;
  long lVar9;
  Vec_Int_t *pVVar10;
  DdManager *pDVar11;
  DdManager *dd;
  int nCubes;
  DdManager *local_40;
  int local_34;
  
  dd = (DdManager *)pNtk->pManFunc;
  p = Vec_IntAlloc(pNtk->vObjs->nSize);
  pVVar10 = p;
  Vec_IntFill(p,pNtk->vObjs->nSize,fMode);
  iVar8 = (int)pVVar10;
  local_40 = dd;
  if (nCubeLimit < 1000000000) {
    iVar8 = pNtk->vObjs->nSize;
    p_00 = (Vec_Ptr_t *)malloc(0x10);
    iVar4 = 8;
    if (6 < iVar8 - 1U) {
      iVar4 = iVar8;
    }
    p_00->nCap = iVar4;
    local_34 = iVar8;
    if (iVar4 == 0) {
      pFuncs = (DdNode **)0x0;
    }
    else {
      pFuncs = (DdNode **)malloc((long)iVar4 << 3);
    }
    p_00->pArray = pFuncs;
    p_00->nSize = iVar8;
    memset(pFuncs,0,(long)iVar8 * 8);
    iVar4 = Cudd_ReorderingStatus(local_40,(Cudd_ReorderingType *)&nCubes);
    if (iVar4 != 0) {
      __assert_fail("!Cudd_ReorderingStatus(dd, (Cudd_ReorderingType *)&nCubes)",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/base/abc/abcFunc.c"
                    ,0x178,"int Abc_NtkBddToSop(Abc_Ntk_t *, int, int)");
    }
    for (lVar9 = 0; dd = local_40, lVar9 < pNtk->vObjs->nSize; lVar9 = lVar9 + 1) {
      pAVar7 = Abc_NtkObj(pNtk,(int)lVar9);
      if (((pAVar7 != (Abc_Obj_t *)0x0) && ((*(uint *)&pAVar7->field_0x14 & 0xf) == 7)) &&
         (iVar4 = Abc_ObjIsBarBuf(pAVar7), iVar4 == 0)) {
        if (iVar8 <= lVar9) {
          __assert_fail("i >= 0 && i < p->nSize",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/misc/vec/vecPtr.h"
                        ,0x1a6,"void Vec_PtrWriteEntry(Vec_Ptr_t *, int, void *)");
        }
        *(anon_union_8_2_00a17ec8_for_Abc_Obj_t__15 *)(pFuncs + lVar9) = pAVar7->field_5;
      }
    }
    nCubes = Extra_bddCountCubes(local_40,pFuncs,local_34,fMode,nCubeLimit,p->pArray);
    Vec_PtrFree(p_00);
    iVar8 = (int)p_00;
    if (nCubes == -1) {
      Vec_IntFree(p);
      return 0;
    }
  }
  if (pNtk->ntkFunc != ABC_FUNC_BDD) {
    __assert_fail("Abc_NtkHasBdd(pNtk)",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/base/abc/abcFunc.c"
                  ,0x187,"int Abc_NtkBddToSop(Abc_Ntk_t *, int, int)");
  }
  if (0 < dd->size) {
    pDVar11 = dd;
    Cudd_zddVarsFromBddVars(dd,2);
    iVar8 = (int)pDVar11;
  }
  pMan = Mem_FlexStart();
  p_01 = Vec_StrAlloc(iVar8);
  iVar8 = 0;
  do {
    if (pNtk->vObjs->nSize <= iVar8) {
      Vec_IntFree(p);
      Vec_StrFree(p_01);
      pNtk->ntkFunc = ABC_FUNC_SOP;
      pNtk->pManFunc = pMan;
      for (iVar8 = 0; iVar8 < pNtk->vObjs->nSize; iVar8 = iVar8 + 1) {
        pAVar7 = Abc_NtkObj(pNtk,iVar8);
        if (((pAVar7 != (Abc_Obj_t *)0x0) && ((*(uint *)&pAVar7->field_0x14 & 0xf) == 7)) &&
           (iVar4 = Abc_ObjIsBarBuf(pAVar7), iVar4 == 0)) {
          Cudd_RecursiveDeref(dd,(DdNode *)(pAVar7->field_5).pData);
          pAVar7->field_5 = (anon_union_8_2_00a17ec8_for_Abc_Obj_t__15)pAVar7->pNext;
          pAVar7->pNext = (Abc_Obj_t *)0x0;
        }
      }
      Extra_StopManager(dd);
      Abc_NtkSortSops(pNtk);
      return 1;
    }
    pAVar7 = Abc_NtkObj(pNtk,iVar8);
    if (((pAVar7 != (Abc_Obj_t *)0x0) && ((*(uint *)&pAVar7->field_0x14 & 0xf) == 7)) &&
       (iVar4 = Abc_ObjIsBarBuf(pAVar7), iVar4 == 0)) {
      bFuncOn = (DdNode *)(pAVar7->field_5).pData;
      if (bFuncOn == (DdNode *)0x0) {
        __assert_fail("pNode->pData",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/base/abc/abcFunc.c"
                      ,0x193,"int Abc_NtkBddToSop(Abc_Ntk_t *, int, int)");
      }
      iVar4 = (pAVar7->vFanins).nSize;
      iVar5 = Vec_IntEntry(p,iVar8);
      pSop = (Abc_Obj_t *)Abc_ConvertBddToSop(pMan,dd,bFuncOn,bFuncOn,iVar4,0,p_01,iVar5);
      pAVar7->pNext = pSop;
      if (pSop == (Abc_Obj_t *)0x0) {
        Mem_FlexStop(pMan,0);
        Abc_NtkCleanNext(pNtk);
        Vec_IntFree(p);
        Vec_StrFree(p_01);
        return 0;
      }
      iVar4 = Abc_SopGetVarNum((char *)pSop);
      if (iVar4 == 0) {
        (pAVar7->vFanins).nSize = 0;
        iVar4 = 0;
      }
      else {
        iVar4 = (pAVar7->vFanins).nSize;
      }
      iVar5 = Abc_SopGetVarNum((char *)pAVar7->pNext);
      if (iVar4 != iVar5) {
        uVar1 = pAVar7->Id;
        uVar2 = *(uint *)&pAVar7->field_0x14;
        uVar3 = (pAVar7->vFanins).nSize;
        uVar6 = Abc_SopGetVarNum((char *)pAVar7->pNext);
        dd = local_40;
        printf("Node %d with level %d has %d fanins but its SOP has support size %d.\n",(ulong)uVar1
               ,(ulong)(uVar2 >> 0xc),(ulong)uVar3,(ulong)uVar6);
        fflush(_stdout);
      }
      iVar4 = (pAVar7->vFanins).nSize;
      iVar5 = Abc_SopGetVarNum((char *)pAVar7->pNext);
      if (iVar4 != iVar5) {
        __assert_fail("Abc_ObjFaninNum(pNode) == Abc_SopGetVarNum((char *)pNode->pNext)",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/base/abc/abcFunc.c"
                      ,0x1a9,"int Abc_NtkBddToSop(Abc_Ntk_t *, int, int)");
      }
    }
    iVar8 = iVar8 + 1;
  } while( true );
}

Assistant:

int Abc_NtkBddToSop( Abc_Ntk_t * pNtk, int fMode, int nCubeLimit )
{
    Vec_Int_t * vGuide;
    Vec_Str_t * vCube;
    Abc_Obj_t * pNode;
    Mem_Flex_t * pManNew;
    DdManager * dd = (DdManager *)pNtk->pManFunc;
    DdNode * bFunc;
    int i, nCubes;

    // compute SOP size
    vGuide = Vec_IntAlloc( Abc_NtkObjNumMax(pNtk) );
    Vec_IntFill( vGuide, Abc_NtkObjNumMax(pNtk), fMode );
    if ( nCubeLimit < ABC_INFINITY )
    {
        // collect all BDDs into one array
        Vec_Ptr_t * vFuncs = Vec_PtrStart( Abc_NtkObjNumMax(pNtk) );
        assert( !Cudd_ReorderingStatus(dd, (Cudd_ReorderingType *)&nCubes) );
        Abc_NtkForEachNode( pNtk, pNode, i )
            if ( !Abc_ObjIsBarBuf(pNode) )
                Vec_PtrWriteEntry( vFuncs, i, pNode->pData );
        // compute the number of cubes in the ISOPs and detemine polarity
        nCubes = Extra_bddCountCubes( dd, (DdNode **)Vec_PtrArray(vFuncs), Vec_PtrSize(vFuncs), fMode, nCubeLimit, Vec_IntArray(vGuide) );
        Vec_PtrFree( vFuncs );
        if ( nCubes == -1 )
        {
            Vec_IntFree( vGuide );
            return 0;
        }
        //printf( "The total number of cubes = %d.\n", nCubes );
    }

    assert( Abc_NtkHasBdd(pNtk) );
    if ( dd->size > 0 )
    Cudd_zddVarsFromBddVars( dd, 2 );
    // create the new manager
    pManNew = Mem_FlexStart();

    // go through the objects
    vCube = Vec_StrAlloc( 100 );
    Abc_NtkForEachNode( pNtk, pNode, i )
    {
        if ( Abc_ObjIsBarBuf(pNode) )
            continue;
        assert( pNode->pData );
        bFunc = (DdNode *)pNode->pData;
        pNode->pNext = (Abc_Obj_t *)Abc_ConvertBddToSop( pManNew, dd, bFunc, bFunc, Abc_ObjFaninNum(pNode), 0, vCube, Vec_IntEntry(vGuide, i) );
        if ( pNode->pNext == NULL )
        {
            Mem_FlexStop( pManNew, 0 );
            Abc_NtkCleanNext( pNtk );
//            printf( "Converting from BDDs to SOPs has failed.\n" );
            Vec_IntFree( vGuide );
            Vec_StrFree( vCube );
            return 0;
        }
        // it may happen that a constant node was created after structural mapping
        if ( Abc_SopGetVarNum((char *)pNode->pNext) == 0 )
            pNode->vFanins.nSize = 0;
        // check the support
        if ( Abc_ObjFaninNum(pNode) != Abc_SopGetVarNum((char *)pNode->pNext) )
        {
            printf( "Node %d with level %d has %d fanins but its SOP has support size %d.\n", 
                pNode->Id, pNode->Level, Abc_ObjFaninNum(pNode), Abc_SopGetVarNum((char *)pNode->pNext) );
            fflush( stdout );
        }
        assert( Abc_ObjFaninNum(pNode) == Abc_SopGetVarNum((char *)pNode->pNext) );
    }
    Vec_IntFree( vGuide );
    Vec_StrFree( vCube );

    // update the network type
    pNtk->ntkFunc = ABC_FUNC_SOP;
    // set the new manager
    pNtk->pManFunc = pManNew;
    // transfer from next to data
    Abc_NtkForEachNode( pNtk, pNode, i )
    {
        if ( Abc_ObjIsBarBuf(pNode) )
            continue;
        Cudd_RecursiveDeref( dd, (DdNode *)pNode->pData );
        pNode->pData = pNode->pNext;
        pNode->pNext = NULL;
    }

    // check for remaining references in the package
    Extra_StopManager( dd );

    // reorder fanins and cubes to make SOPs more human-readable
    Abc_NtkSortSops( pNtk );
    return 1;
}